

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O1

int Curl_socket_check(curl_socket_t readfd0,curl_socket_t readfd1,curl_socket_t writefd,
                     timediff_t timeout_ms)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  bool bVar6;
  pollfd pfd [3];
  pollfd local_38 [4];
  
  if ((readfd1 & readfd0 & writefd) == 0xffffffff) {
    iVar2 = Curl_wait_ms(timeout_ms);
    return iVar2;
  }
  bVar6 = readfd0 != -1;
  if (bVar6) {
    local_38[0].events = 0xc3;
    local_38[0].revents = 0;
    local_38[0].fd = readfd0;
  }
  uVar5 = (ulong)bVar6;
  if (readfd1 != -1) {
    local_38[uVar5].fd = readfd1;
    local_38[uVar5].events = 0xc3;
    local_38[uVar5].revents = 0;
    uVar5 = (ulong)(bVar6 + 1);
  }
  uVar4 = (uint)uVar5;
  if (writefd != -1) {
    local_38[uVar5].fd = writefd;
    local_38[uVar5].events = 0x106;
    local_38[uVar5].revents = 0;
    uVar4 = uVar4 + 1;
  }
  uVar4 = Curl_poll(local_38,uVar4,timeout_ms);
  if (0 < (int)uVar4) {
    if (readfd0 == -1) {
      uVar3 = 0;
      uVar4 = 0;
    }
    else {
      bVar6 = (local_38[0]._4_4_ & 0x590000) != 0;
      uVar4 = bVar6 + 4;
      if ((local_38[0]._4_4_ & 0xa20000) == 0) {
        uVar4 = (uint)bVar6;
      }
      uVar3 = 1;
    }
    if (readfd1 != -1) {
      uVar1 = uVar4 + 8;
      if ((local_38[uVar3].revents & 0x59U) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = uVar1 | 4;
      if ((local_38[uVar3].revents & 0xa2U) == 0) {
        uVar4 = uVar1;
      }
      uVar3 = uVar3 + 1;
    }
    if (writefd != -1) {
      uVar1 = uVar4 | 2;
      if ((local_38[uVar3].revents & 0x104U) == 0) {
        uVar1 = uVar4;
      }
      uVar4 = uVar1 | 4;
      if ((local_38[uVar3].revents & 0x3aU) == 0) {
        uVar4 = uVar1;
      }
    }
  }
  return uVar4;
}

Assistant:

int Curl_socket_check(curl_socket_t readfd0, /* two sockets to read from */
                      curl_socket_t readfd1,
                      curl_socket_t writefd, /* socket to write to */
                      timediff_t timeout_ms) /* milliseconds to wait */
{
  struct pollfd pfd[3];
  int num;
  int r;

  if((readfd0 == CURL_SOCKET_BAD) && (readfd1 == CURL_SOCKET_BAD) &&
     (writefd == CURL_SOCKET_BAD)) {
    /* no sockets, just wait */
    return Curl_wait_ms(timeout_ms);
  }

  /* Avoid initial timestamp, avoid Curl_now() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd0;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd1;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    pfd[num].fd = writefd;
    pfd[num].events = POLLWRNORM|POLLOUT|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }

  r = Curl_poll(pfd, num, timeout_ms);
  if(r <= 0)
    return r;

  r = 0;
  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      r |= CURL_CSELECT_IN;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      r |= CURL_CSELECT_IN2;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLWRNORM|POLLOUT))
      r |= CURL_CSELECT_OUT;
    if(pfd[num].revents & (POLLERR|POLLHUP|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
  }

  return r;
}